

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sock_test.c
# Opt level: O0

void test_listen_url(void)

{
  nng_err nVar1;
  int iVar2;
  char *pcVar3;
  char *pcVar4;
  nng_err result__3;
  nng_err result__2;
  nng_err result__1;
  nng_err result_;
  nng_url *u2;
  nng_url *u;
  nng_listener l;
  nng_socket s1;
  
  nVar1 = nng_pair1_open((nng_socket *)((long)&u + 4));
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sock_test.c"
                         ,0x176,"%s: expected success, got %s (%d)","nng_pair1_open(&(s1))",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_url_parse(&u2,"inproc://listen_url");
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sock_test.c"
                         ,0x177,"%s: expected success, got %s (%d)",
                         "nng_url_parse(&u, \"inproc://listen_url\")",pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nVar1 = nng_listen_url(u._4_4_,u2,(nng_listener *)&u,0);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sock_test.c"
                         ,0x179,"%s: expected success, got %s (%d)","nng_listen_url(s1, u, &l, 0)",
                         pcVar3,nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  nng_listener_get_url(u._0_4_,(nng_url **)&result__1);
  pcVar3 = nng_url_scheme(u2);
  pcVar4 = nng_url_scheme(_result__1);
  iVar2 = strcmp(pcVar3,pcVar4);
  pcVar3 = nng_url_scheme(u2);
  pcVar4 = nng_url_scheme(_result__1);
  acutest_check_((uint)(iVar2 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sock_test.c"
                 ,0x17c,"%s == %s",pcVar3,pcVar4);
  pcVar3 = nng_url_path(u2);
  pcVar4 = nng_url_path(_result__1);
  iVar2 = strcmp(pcVar3,pcVar4);
  pcVar3 = nng_url_path(u2);
  pcVar4 = nng_url_path(_result__1);
  acutest_check_((uint)(iVar2 == 0),
                 "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sock_test.c"
                 ,0x17d,"%s == %s",pcVar3,pcVar4);
  nng_url_free(u2);
  nVar1 = nng_socket_close(u._4_4_);
  pcVar3 = nng_strerror(nVar1);
  iVar2 = acutest_check_((uint)(nVar1 == NNG_OK),
                         "/workspace/llm4binary/github/license_c_cmakelists/nanomsg[P]nng/src/core/sock_test.c"
                         ,0x180,"%s: expected success, got %s (%d)","nng_socket_close(s1)",pcVar3,
                         nVar1);
  if (iVar2 == 0) {
    acutest_abort_();
  }
  return;
}

Assistant:

void
test_listen_url(void)
{
	nng_socket     s1;
	nng_listener   l;
	nng_url       *u;
	const nng_url *u2;

	NUTS_OPEN(s1);
	NUTS_PASS(nng_url_parse(&u, "inproc://listen_url"));

	NUTS_PASS(nng_listen_url(s1, u, &l, 0));
	nng_listener_get_url(l, &u2);

	NUTS_MATCH(nng_url_scheme(u), nng_url_scheme(u2));
	NUTS_MATCH(nng_url_path(u), nng_url_path(u2));
	nng_url_free(u);

	NUTS_CLOSE(s1);
}